

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# import.c
# Opt level: O1

_Bool export_ssh2(Filename *filename,int type,ssh2_userkey *key,char *passphrase)

{
  BinarySink *pBVar1;
  BinarySink *bs;
  uint uVar2;
  ptrlen input;
  char *pcVar3;
  _Bool _Var4;
  uint8_t uVar5;
  uint uVar6;
  ssh_key *psVar7;
  ssh_keyalg *psVar8;
  ssh_keyalg *psVar9;
  ulong *puVar10;
  mp_int *n;
  mp_int *r;
  mp_int *r_00;
  mp_int *x;
  mp_int *x_00;
  size_t sVar11;
  size_t sVar12;
  uint8_t *puVar13;
  void *pvVar14;
  strbuf *psVar15;
  size_t sVar16;
  FILE *pFVar17;
  int iVar18;
  void **ppvVar19;
  size_t *psVar20;
  ulong *puVar21;
  int len;
  char *pcVar22;
  void *pvVar23;
  size_t *psVar24;
  void **ppvVar25;
  size_t *psVar26;
  void **ppvVar27;
  void **ppvVar28;
  uint uVar29;
  size_t sVar30;
  uint8_t *puVar31;
  long lVar32;
  ulong uVar33;
  ssh_keyalg *psVar34;
  void *pvVar35;
  strbuf *buf_o;
  ptrlen pl;
  ptrlen pVar36;
  ptrlen pVar37;
  ptrlen pVar38;
  ptrlen pVar39;
  ptrlen pVar40;
  ptrlen passphrase_00;
  char zero [1];
  BinarySource src [1];
  uchar iv [8];
  uint8_t padding_buf [8];
  undefined1 local_1e9;
  uchar *local_1e8;
  strbuf *local_1e0;
  strbuf *local_1d8;
  ptrlen local_1d0;
  undefined1 *local_1c0;
  void *local_1b8;
  void *local_1b0;
  ptrlen local_1a8;
  ssh_keyalg *local_198;
  char *local_190;
  ssh_keyalg *local_188;
  Filename *local_180;
  BinarySource local_178;
  void **local_150;
  ulong *local_148;
  void **local_140;
  size_t *local_138;
  undefined8 local_130;
  undefined1 *local_128;
  size_t local_120;
  void *local_118;
  size_t local_110;
  void *local_108;
  size_t local_100;
  void *local_f8;
  size_t local_f0;
  void *local_e8;
  ulong local_e0;
  void *local_d8;
  size_t local_d0;
  void *local_c8;
  size_t local_c0;
  void *local_b8;
  ulong local_b0;
  void *local_a8;
  size_t local_a0 [2];
  size_t local_90;
  void *local_88;
  size_t local_80;
  void *local_78;
  void *local_70;
  size_t local_68;
  void *local_60;
  uint8_t local_58 [40];
  
  puVar21 = &local_e0;
  local_190 = passphrase;
  if (type != 7) {
    if (type == 6) {
LAB_001142a5:
      _Var4 = openssh_new_write(filename,key,passphrase);
      return _Var4;
    }
    if (type != 4) {
      return false;
    }
    psVar7 = (*key->key->vt->base_key)(key->key);
    psVar34 = psVar7->vt;
    if ((((psVar34 != &ssh_ecdsa_nistp521) && (psVar34 != &ssh_ecdsa_nistp384)) &&
        (psVar34 != &ssh_ecdsa_nistp256)) && ((psVar34 != &ssh_dsa && (psVar34 != &ssh_rsa))))
    goto LAB_001142a5;
    psVar7 = (*key->key->vt->base_key)(key->key);
    psVar8 = (ssh_keyalg *)strbuf_new();
    (*psVar7->vt->public_blob)(psVar7,(BinarySink *)&psVar8->freekey);
    psVar9 = (ssh_keyalg *)strbuf_new_nm();
    (*psVar7->vt->private_blob)(psVar7,(BinarySink *)&psVar9->freekey);
    local_1d8 = strbuf_new_nm();
    psVar34 = psVar7->vt;
    local_198 = psVar8;
    local_188 = psVar9;
    if (psVar34 == &ssh_rsa || psVar34 == &ssh_dsa) {
      local_178.data = psVar8->new_priv;
      local_178.len = (size_t)psVar8->new_priv_openssh;
      local_178.pos = 0;
      local_178.err = BSE_NO_ERROR;
      local_180 = filename;
      local_178.binarysource_ = &local_178;
      BinarySource_get_string(&local_178);
      local_1a8 = BinarySource_get_string(local_178.binarysource_);
      if (psVar34 == &ssh_rsa) {
        pVar36 = BinarySource_get_string(local_178.binarysource_);
        local_1e8 = (uchar *)pVar36.len;
        local_1e0 = (strbuf *)pVar36.ptr;
        local_178.data = psVar9->new_priv;
        local_178.len = (size_t)psVar9->new_priv_openssh;
        local_178.pos = 0;
        local_178.err = BSE_NO_ERROR;
        local_178.binarysource_ = &local_178;
        pVar36 = BinarySource_get_string(&local_178);
        pVar37 = BinarySource_get_string(local_178.binarysource_);
        pVar39 = BinarySource_get_string(local_178.binarysource_);
        pVar40 = BinarySource_get_string(local_178.binarysource_);
        local_68 = pVar40.len;
        local_60 = pVar40.ptr;
        if ((local_178.binarysource_)->err != BSE_NO_ERROR) {
          __assert_fail("!get_err(src)",
                        "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/import.c"
                        ,0x36c,
                        "_Bool openssh_pem_write(const Filename *, ssh2_userkey *, const char *)");
        }
        local_90 = pVar36.len;
        local_88 = pVar36.ptr;
        n = mp_from_bytes_be(pVar36);
        local_80 = pVar37.len;
        local_78 = pVar37.ptr;
        r = mp_from_bytes_be(pVar37);
        local_1c0 = (undefined1 *)pVar39.len;
        local_70 = pVar39.ptr;
        r_00 = mp_from_bytes_be(pVar39);
        mp_sub_integer_into(r,r,1);
        mp_sub_integer_into(r_00,r_00,1);
        x = mp_mod(n,r);
        x_00 = mp_mod(n,r_00);
        mp_free(n);
        mp_free(r);
        mp_free(r_00);
        sVar11 = mp_get_nbits(x);
        uVar33 = sVar11 + 8 >> 3;
        sVar12 = mp_get_nbits(x_00);
        local_1b8 = (void *)(sVar12 + 8 >> 3);
        local_1b0 = (void *)(long)((int)local_1b8 + (int)uVar33);
        local_1d0.len = uVar33;
        puVar13 = (uint8_t *)safemalloc((size_t)local_1b0,1,0);
        local_1d0.ptr = puVar13;
        puVar31 = puVar13;
        sVar30 = local_1d0.len;
        if (sVar11 < 0xfffffffffffffff8) {
          do {
            sVar30 = sVar30 - 1;
            uVar5 = mp_get_byte(x,sVar30);
            *puVar31 = uVar5;
            puVar31 = puVar31 + 1;
          } while (sVar30 != 0);
        }
        puVar13 = puVar13 + local_1d0.len;
        puVar31 = puVar13;
        pvVar23 = local_1b8;
        if (sVar12 < 0xfffffffffffffff8) {
          do {
            pvVar23 = (void *)((long)pvVar23 - 1);
            uVar5 = mp_get_byte(x_00,(size_t)pvVar23);
            *puVar31 = uVar5;
            puVar31 = puVar31 + 1;
          } while (pvVar23 != (void *)0x0);
        }
        local_138 = local_a0;
        local_140 = &local_a8;
        local_148 = &local_b0;
        local_150 = &local_b8;
        psVar24 = &local_c0;
        ppvVar25 = &local_c8;
        mp_free(x);
        mp_free(x_00);
        local_118 = local_1e0;
        local_110 = (size_t)local_1e8;
        local_108 = local_1a8.ptr;
        local_100 = local_1a8.len;
        local_f8 = local_88;
        local_f0 = local_90;
        iVar18 = 9;
        local_1e8 = "-----BEGIN RSA PRIVATE KEY-----\n";
        local_1e0 = (strbuf *)0x13d835;
        psVar20 = &local_e0;
        ppvVar27 = &local_e8;
        psVar26 = &local_d0;
        ppvVar19 = &local_d8;
        pVar38.len = local_68;
        pVar38.ptr = local_60;
        pvVar14 = local_78;
        pvVar23 = local_1d0.ptr;
        sVar30 = local_80;
        pvVar35 = local_70;
      }
      else {
        pVar36 = BinarySource_get_string(local_178.binarysource_);
        local_1c0 = (undefined1 *)pVar36.len;
        local_1d0 = BinarySource_get_string(local_178.binarysource_);
        pVar37 = BinarySource_get_string(local_178.binarysource_);
        local_1b8 = (void *)pVar37.len;
        puVar13 = (uint8_t *)pVar37.ptr;
        local_178.data = psVar9->new_priv;
        local_178.len = (size_t)psVar9->new_priv_openssh;
        local_178.pos = 0;
        local_178.err = BSE_NO_ERROR;
        local_178.binarysource_ = &local_178;
        pVar38 = BinarySource_get_string(&local_178);
        local_138 = &local_d0;
        local_140 = &local_d8;
        if ((local_178.binarysource_)->err != BSE_NO_ERROR) {
          __assert_fail("!get_err(src)",
                        "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/import.c"
                        ,0x3a4,
                        "_Bool openssh_pem_write(const Filename *, ssh2_userkey *, const char *)");
        }
        local_148 = &local_e0;
        local_150 = &local_e8;
        psVar24 = &local_f0;
        ppvVar25 = &local_f8;
        psVar26 = &local_100;
        ppvVar19 = &local_108;
        psVar20 = &local_110;
        ppvVar27 = &local_118;
        iVar18 = 6;
        local_1e8 = "-----BEGIN DSA PRIVATE KEY-----\n";
        local_1e0 = (strbuf *)0x13d875;
        local_1b0 = (void *)0x0;
        pvVar14 = local_1a8.ptr;
        pvVar23 = (void *)0x0;
        sVar30 = local_1a8.len;
        pvVar35 = pVar36.ptr;
      }
      local_128 = &local_1e9;
      local_120 = 1;
      local_1e9 = 0;
      *ppvVar27 = pvVar14;
      *psVar20 = sVar30;
      *ppvVar19 = pvVar35;
      *psVar26 = (size_t)local_1c0;
      *ppvVar25 = local_1d0.ptr;
      *psVar24 = local_1d0.len;
      *local_150 = puVar13;
      *local_148 = (ulong)local_1b8;
      *local_140 = pVar38.ptr;
      *local_138 = pVar38.len;
      psVar15 = strbuf_new_nm();
      uVar33 = 0;
      do {
        sVar30 = *(size_t *)((long)&local_120 + uVar33);
        BinarySink_put_ber_id_len(psVar15->binarysink_,2,(int)sVar30,0);
        pl.len = sVar30;
        pl.ptr = *(void **)((long)&local_128 + uVar33);
        BinarySink_put_datapl(psVar15->binarysink_,pl);
        buf_o = local_1d8;
        uVar33 = uVar33 + 0x10;
      } while ((uint)(iVar18 << 4) != uVar33);
      pBVar1 = local_1d8->binarysink_;
      BinarySink_put_ber_id_len(pBVar1,0x10,(int)psVar15->len,0x20);
      BinarySink_put_data(pBVar1,psVar15->s,psVar15->len);
      strbuf_free(psVar15);
      psVar34 = local_198;
    }
    else {
      if (((psVar34 != &ssh_ecdsa_nistp521) && (psVar34 != &ssh_ecdsa_nistp256)) &&
         (psVar34 != &ssh_ecdsa_nistp384)) {
        local_180 = filename;
        __assert_fail("false && \"bad key alg in openssh_pem_write\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/import.c",
                      0x3f9,
                      "_Bool openssh_pem_write(const Filename *, ssh2_userkey *, const char *)");
      }
      local_180 = filename;
      local_1e8 = ec_alg_oid(psVar34,(int *)&local_178);
      uVar6 = (uint)((ulong)((psVar7[-3].vt)->freekey + 7) >> 2);
      psVar15 = strbuf_new_nm();
      pBVar1 = psVar15->binarysink_;
      local_1e0 = psVar15;
      BinarySink_put_byte(psVar15->binarysink_[0].binarysink_,'\x02');
      BinarySink_put_byte(psVar15->binarysink_[0].binarysink_,'\x01');
      BinarySink_put_byte(pBVar1,'\x01');
      psVar34 = local_188;
      local_1b0 = (void *)0x0;
      BinarySink_put_ber_id_len(pBVar1,4,*(int *)&local_188->new_priv_openssh + -4,0);
      BinarySink_put_data(pBVar1,psVar34->new_pub + 4,(size_t)(psVar34->new_priv_openssh + -4));
      psVar15 = strbuf_new();
      BinarySink_put_ber_id_len(psVar15->binarysink_,6,(int)local_178.data,0);
      BinarySink_put_data(psVar15->binarysink_,local_1e8,(long)(int)local_178.data);
      BinarySink_put_ber_id_len(pBVar1,0,(int)psVar15->len,0xa0);
      BinarySink_put_data(pBVar1,psVar15->s,psVar15->len);
      strbuf_free(psVar15);
      psVar15 = strbuf_new();
      bs = psVar15->binarysink_;
      BinarySink_put_ber_id_len(bs,3,(uVar6 & 0xfffffffe) + 2,0);
      BinarySink_put_byte(bs,'\0');
      psVar34 = local_198;
      BinarySink_put_data(bs,local_198->new_pub + 0x27,(long)(int)uVar6 | 1);
      BinarySink_put_ber_id_len(pBVar1,1,(int)psVar15->len,0xa0);
      BinarySink_put_data(pBVar1,psVar15->s,psVar15->len);
      strbuf_free(psVar15);
      buf_o = local_1d8;
      psVar15 = local_1e0;
      pBVar1 = local_1d8->binarysink_;
      BinarySink_put_ber_id_len(pBVar1,0x10,(int)local_1e0->len,0x20);
      BinarySink_put_data(pBVar1,psVar15->s,psVar15->len);
      strbuf_free(psVar15);
      local_1e8 = "-----BEGIN EC PRIVATE KEY-----\n";
      local_1e0 = (strbuf *)0x13d8b4;
      pvVar23 = (void *)0x0;
    }
    pcVar22 = local_190;
    if (local_190 != (char *)0x0) {
      uVar6 = (uint)buf_o->len;
      len = (uVar6 & 0xfffffff8) + 8;
      iVar18 = len - uVar6;
      BinarySink_put_padding(buf_o->binarysink_,(long)iVar18,(uchar)iVar18);
      random_read(&local_130,8);
      sVar16 = strlen(pcVar22);
      passphrase_00.len = sVar16;
      passphrase_00.ptr = pcVar22;
      openssh_pem_derivekey(passphrase_00,&local_130,local_58);
      des3_encrypt_pubkey_ossh(local_58,&local_130,local_1d8->u,len);
      buf_o = local_1d8;
      smemclr(local_58,0x20);
    }
    pFVar17 = (FILE *)f_open(local_180,"wb",true);
    _Var4 = pFVar17 != (FILE *)0x0;
    if (_Var4) {
      fputs((char *)local_1e8,pFVar17);
      if (pcVar22 != (char *)0x0) {
        fwrite("Proc-Type: 4,ENCRYPTED\nDEK-Info: DES-EDE3-CBC,",0x2e,1,pFVar17);
        lVar32 = 0;
        do {
          fprintf(pFVar17,"%02X",(ulong)*(byte *)((long)&local_130 + lVar32));
          lVar32 = lVar32 + 1;
        } while (lVar32 != 8);
        fwrite("\n\n",2,1,pFVar17);
        buf_o = local_1d8;
      }
      input.ptr = buf_o->u;
      input.len = buf_o->len;
      base64_encode_fp((FILE *)pFVar17,input,0x40);
      fputs((char *)local_1e0,pFVar17);
      fclose(pFVar17);
    }
    if (buf_o != (strbuf *)0x0) {
      strbuf_free(buf_o);
    }
    if (pvVar23 != (void *)0x0) {
      smemclr(pvVar23,(size_t)local_1b0);
      safefree(pvVar23);
    }
    if (local_188 != (ssh_keyalg *)0x0) {
      strbuf_free((strbuf *)local_188);
    }
    goto joined_r0x00114c59;
  }
  psVar8 = (ssh_keyalg *)strbuf_new();
  (*key->key->vt->public_blob)(key->key,(BinarySink *)&psVar8->freekey);
  psVar15 = strbuf_new_nm();
  (*key->key->vt->private_blob)(key->key,psVar15->binarysink_);
  psVar34 = key->key->vt;
  local_1d8 = psVar15;
  local_188 = psVar8;
  if (psVar34 == &ssh_rsa) {
    local_178.data = psVar8->new_priv;
    local_178.len = (size_t)psVar8->new_priv_openssh;
    local_178.pos = 0;
    local_178.err = BSE_NO_ERROR;
    local_198 = psVar34;
    local_180 = filename;
    local_178.binarysource_ = &local_178;
    BinarySource_get_string(&local_178);
    pVar37 = BinarySource_get_string(local_178.binarysource_);
    local_1c0 = (undefined1 *)pVar37.ptr;
    pVar36 = BinarySource_get_string(local_178.binarysource_);
    local_1e0 = (strbuf *)pVar36.len;
    local_1b0 = pVar36.ptr;
    local_178.data = psVar15->u;
    local_178.len = psVar15->len;
    local_178.pos = 0;
    local_178.err = BSE_NO_ERROR;
    local_178.binarysource_ = &local_178;
    pVar36 = BinarySource_get_string(&local_178);
    pVar39 = BinarySource_get_string(local_178.binarysource_);
    local_1a8.len = (size_t)pVar39.ptr;
    local_1a8.ptr = (void *)pVar39.len;
    pVar39 = BinarySource_get_string(local_178.binarysource_);
    local_1b8 = pVar39.ptr;
    local_1d0.ptr = (void *)pVar39.len;
    pVar39 = BinarySource_get_string(local_178.binarysource_);
    local_1e8 = (uchar *)pVar39.ptr;
    local_1d0.len = pVar39.len;
    if ((local_178.binarysource_)->err != BSE_NO_ERROR) {
      __assert_fail("!get_err(src)",
                    "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/import.c",
                    0x899,"_Bool sshcom_write(const Filename *, ssh2_userkey *, const char *)");
    }
    local_128 = local_1c0;
    iVar18 = 6;
    pcVar22 = "if-modn{sign{rsa-pkcs1-sha1},encrypt{rsa-pkcs1v2-oaep}}";
    puVar10 = &local_e0;
    ppvVar19 = &local_e8;
    puVar21 = &local_d0;
    ppvVar25 = &local_d8;
    psVar24 = &local_f0;
    ppvVar27 = &local_f8;
    psVar26 = &local_100;
    ppvVar28 = &local_108;
    psVar20 = &local_110;
    passphrase = local_190;
    local_120 = pVar37.len;
LAB_00114998:
    local_118 = pVar36.ptr;
    *psVar20 = pVar36.len;
    *ppvVar28 = local_1b0;
    *psVar26 = (size_t)local_1e0;
    *ppvVar27 = local_1e8;
    *psVar24 = local_1d0.len;
    *ppvVar19 = local_1b8;
    *puVar10 = (ulong)local_1d0.ptr;
    *ppvVar25 = (void *)local_1a8.len;
    *puVar21 = (ulong)local_1a8.ptr;
    psVar15 = strbuf_new_nm();
    pBVar1 = psVar15->binarysink_;
    BinarySink_put_uint32(pBVar1,0x3f6ff9eb);
    BinarySink_put_uint32(pBVar1,0);
    BinarySink_put_stringz(pBVar1,pcVar22);
    pcVar22 = "3des-cbc";
    if (passphrase == (char *)0x0) {
      pcVar22 = "none";
    }
    BinarySink_put_stringz(pBVar1,pcVar22);
    sVar30 = psVar15->len;
    BinarySink_put_uint32(pBVar1,0);
    BinarySink_put_uint32(pBVar1,0);
    if (local_198 != &ssh_rsa) {
      BinarySink_put_uint32(pBVar1,0);
    }
    uVar33 = 0;
    do {
      pVar37.len = *(size_t *)((long)&local_120 + uVar33);
      pVar37.ptr = *(void **)((long)&local_128 + uVar33);
      BinarySink_put_mp_sshcom_from_string(pBVar1,pVar37);
      uVar33 = uVar33 + 0x10;
    } while ((uint)(iVar18 << 4) != uVar33);
    uVar29 = (uint)sVar30;
    uVar6 = ((int)psVar15->len - uVar29) - 8;
    *(uint *)(psVar15->s + (long)(int)uVar29 + 4) =
         uVar6 >> 0x18 | (uVar6 & 0xff0000) >> 8 | (uVar6 & 0xff00) << 8 | uVar6 * 0x1000000;
    if (local_190 != (char *)0x0) {
      uVar33 = (ulong)((uVar29 ^ 4) - (int)psVar15->len & 7);
      random_read(local_58,uVar33);
      BinarySink_put_data(pBVar1,local_58,uVar33);
    }
    pcVar3 = local_190;
    pcVar22 = psVar15->s;
    uVar6 = ((int)psVar15->len - uVar29) - 4;
    if ((local_190 != (char *)0x0) && ((uVar6 & 7) != 0)) {
      __assert_fail("!passphrase || cipherlen % 8 == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/import.c",
                    0x8e0,"_Bool sshcom_write(const Filename *, ssh2_userkey *, const char *)");
    }
    *(uint *)(pcVar22 + (int)uVar29) =
         uVar6 >> 0x18 | (uVar6 & 0xff0000) >> 8 | (uVar6 & 0xff00) << 8 | uVar6 * 0x1000000;
    uVar2 = (uint)psVar15->len;
    *(uint *)(psVar15->s + 4) =
         uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18;
    if (local_190 != (char *)0x0) {
      sVar16 = strlen(local_190);
      pVar39.len = sVar16;
      pVar39.ptr = pcVar3;
      sshcom_derivekey(pVar39,local_58);
      local_130 = 0;
      des3_encrypt_pubkey_ossh(local_58,&local_130,pcVar22 + (long)(int)uVar29 + 4,uVar6);
      smemclr(local_58,0x20);
    }
    pFVar17 = (FILE *)f_open(local_180,"wb",true);
    if (pFVar17 == (FILE *)0x0) {
      _Var4 = false;
    }
    else {
      fputs("---- BEGIN SSH2 ENCRYPTED PRIVATE KEY ----\n",pFVar17);
      fwrite("Comment: \"",10,1,pFVar17);
      pcVar22 = key->comment;
      sVar16 = strlen(pcVar22);
      if (0x3c < (int)sVar16) {
        lVar32 = 0x3c;
        do {
          fprintf(pFVar17,"%.*s\\\n",lVar32,pcVar22);
          pcVar22 = pcVar22 + lVar32;
          sVar16 = strlen(pcVar22);
          lVar32 = 0x46;
        } while (0x46 < (int)sVar16);
      }
      fprintf(pFVar17,"%s\"\n",pcVar22);
      pVar40.ptr = psVar15->u;
      pVar40.len = psVar15->len;
      base64_encode_fp((FILE *)pFVar17,pVar40,0x46);
      fputs("---- END SSH2 ENCRYPTED PRIVATE KEY ----\n",pFVar17);
      fclose(pFVar17);
      _Var4 = true;
    }
  }
  else {
    _Var4 = false;
    if (psVar34 == &ssh_dsa) {
      local_178.data = psVar8->new_priv;
      local_178.len = (size_t)psVar8->new_priv_openssh;
      local_178.pos = 0;
      local_178.err = BSE_NO_ERROR;
      local_198 = psVar34;
      local_180 = filename;
      local_178.binarysource_ = &local_178;
      BinarySource_get_string(&local_178);
      pVar37 = BinarySource_get_string(local_178.binarysource_);
      local_1c0 = (undefined1 *)pVar37.len;
      pVar36 = BinarySource_get_string(local_178.binarysource_);
      local_1d0.len = pVar36.len;
      local_1e8 = (uchar *)pVar36.ptr;
      pVar36 = BinarySource_get_string(local_178.binarysource_);
      local_1e0 = (strbuf *)pVar36.len;
      local_1b0 = pVar36.ptr;
      pVar36 = BinarySource_get_string(local_178.binarysource_);
      local_1b8 = pVar36.ptr;
      local_1d0.ptr = (void *)pVar36.len;
      local_178.data = local_1d8->u;
      local_178.len = local_1d8->len;
      local_178.pos = 0;
      local_178.err = BSE_NO_ERROR;
      local_178.binarysource_ = &local_178;
      pVar39 = BinarySource_get_string(&local_178);
      pVar36.len = (size_t)local_1c0;
      pVar36.ptr = local_118;
      local_1a8.len = (size_t)pVar39.ptr;
      local_1a8.ptr = (void *)pVar39.len;
      if ((local_178.binarysource_)->err != BSE_NO_ERROR) {
        __assert_fail("!get_err(src)",
                      "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/import.c",
                      0x8b5,"_Bool sshcom_write(const Filename *, ssh2_userkey *, const char *)");
      }
      ppvVar25 = &local_e8;
      puVar10 = &local_f0;
      ppvVar19 = &local_f8;
      psVar24 = &local_100;
      ppvVar27 = &local_108;
      psVar26 = &local_110;
      ppvVar28 = &local_118;
      psVar20 = &local_120;
      iVar18 = 5;
      pcVar22 = "dl-modp{sign{dsa-nist-sha1},dh{plain}}";
      local_128 = (undefined1 *)pVar37.ptr;
      goto LAB_00114998;
    }
    psVar15 = (strbuf *)0x0;
  }
  if (psVar15 != (strbuf *)0x0) {
    strbuf_free(psVar15);
  }
  psVar34 = local_188;
  if (local_1d8 != (strbuf *)0x0) {
    strbuf_free(local_1d8);
    psVar34 = local_188;
  }
joined_r0x00114c59:
  if (psVar34 != (ssh_keyalg *)0x0) {
    strbuf_free((strbuf *)psVar34);
  }
  return _Var4;
}

Assistant:

bool export_ssh2(const Filename *filename, int type,
                 ssh2_userkey *key, char *passphrase)
{
    if (type == SSH_KEYTYPE_OPENSSH_AUTO)
        return openssh_auto_write(filename, key, passphrase);
    if (type == SSH_KEYTYPE_OPENSSH_NEW)
        return openssh_new_write(filename, key, passphrase);
    if (type == SSH_KEYTYPE_SSHCOM)
        return sshcom_write(filename, key, passphrase);
    return false;
}